

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

BIGNUM * BN_copy(BIGNUM *a,BIGNUM *b)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  BIGNUM *pBVar5;
  ulong *puVar6;
  ulong *puVar7;
  int iVar8;
  
  if (a != b) {
    pBVar5 = a;
    if (a->dmax < b->top) {
      pBVar5 = bn_expand2(a,b->top);
    }
    if (pBVar5 == (BIGNUM *)0x0) {
      a = (BIGNUM *)0x0;
    }
    else {
      puVar6 = a->d;
      puVar7 = b->d;
      uVar1 = b->top;
      if (0 < (int)uVar1 >> 2) {
        iVar8 = ((int)uVar1 >> 2) + 1;
        do {
          uVar2 = puVar7[1];
          uVar3 = puVar7[2];
          uVar4 = puVar7[3];
          *puVar6 = *puVar7;
          puVar6[1] = uVar2;
          puVar6[2] = uVar3;
          puVar6[3] = uVar4;
          puVar6 = puVar6 + 4;
          puVar7 = puVar7 + 4;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
      switch(uVar1 & 3) {
      case 3:
        puVar6[2] = puVar7[2];
      case 2:
        puVar6[1] = puVar7[1];
      case 1:
        *puVar6 = *puVar7;
      case 0:
        a->top = uVar1;
        a->neg = b->neg;
      }
    }
  }
  return a;
}

Assistant:

BIGNUM *BN_copy(BIGNUM *a, const BIGNUM *b)
{
    int i;
    BN_ULONG *A;
    const BN_ULONG *B;

    bn_check_top(b);

    if (a == b)
        return (a);
    if (bn_wexpand(a, b->top) == NULL)
        return (NULL);

    A = a->d;
    B = b->d;
    for (i = b->top >> 2; i > 0; i--, A += 4, B += 4) {
        BN_ULONG a0, a1, a2, a3;
        a0 = B[0];
        a1 = B[1];
        a2 = B[2];
        a3 = B[3];
        A[0] = a0;
        A[1] = a1;
        A[2] = a2;
        A[3] = a3;
    }
    /* ultrix cc workaround, see comments in bn_expand_internal */
    switch (b->top & 3) {
    case 3:
        A[2] = B[2];
    case 2:
        A[1] = B[1];
    case 1:
        A[0] = B[0];
    case 0:;
    }

    a->top = b->top;
    a->neg = b->neg;
    bn_check_top(a);
    return (a);
}